

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read_chunk(p_ply ply,void *anybuffer,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  
  if (size != 0) {
    uVar2 = 0;
    do {
      if (ply->buffer_first < ply->buffer_last) {
        *(char *)((long)anybuffer + uVar2) = ply->buffer[ply->buffer_first];
        ply->buffer_first = ply->buffer_first + 1;
        uVar2 = uVar2 + 1;
      }
      else {
        ply->buffer_first = 0;
        sVar1 = fread(ply->buffer,1,0x2000,(FILE *)ply->fp);
        ply->buffer_last = sVar1;
        if (sVar1 == 0) {
          return 0;
        }
      }
    } while (uVar2 < size);
  }
  return 1;
}

Assistant:

static int ply_read_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    assert(ply->buffer_first <= ply->buffer_last);
    while (i < size) {
        if (ply->buffer_first < ply->buffer_last) {
            buffer[i] = ply->buffer[ply->buffer_first];
            ply->buffer_first++;
            i++;
        } else {
            ply->buffer_first = 0;
            ply->buffer_last = fread(ply->buffer, 1, BUFFERSIZE, ply->fp);
            if (ply->buffer_last <= 0) return 0;
        }
    }
    return 1;
}